

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O1

void __thiscall clask::server_t::server_t(server_t *this)

{
  (this->compiled_tree)._M_dataplus._M_p = (pointer)&(this->compiled_tree).field_2;
  (this->compiled_tree)._M_string_length = 0;
  (this->compiled_tree).field_2._M_local_buf[0] = '\0';
  (this->treeGET).children.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->treeGET).children.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->treeGET).children.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->treeGET).name._M_dataplus._M_p = (pointer)&(this->treeGET).name.field_2;
  (this->treeGET).name._M_string_length = 0;
  (this->treeGET).name.field_2._M_local_buf[0] = '\0';
  *(undefined8 *)&(this->treeGET).fn.f_writer.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->treeGET).fn.f_writer.super__Function_base._M_functor + 8) = 0;
  (this->treeGET).fn.f_writer.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->treeGET).fn.f_writer._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->treeGET).fn.f_string.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->treeGET).fn.f_string.super__Function_base._M_functor + 8) = 0;
  (this->treeGET).fn.f_string.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->treeGET).fn.f_string._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->treeGET).fn.f_response.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->treeGET).fn.f_response.super__Function_base._M_functor + 8) = 0;
  (this->treeGET).fn.f_response.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->treeGET).fn.f_response._M_invoker = (_Invoker_type)0x0;
  (this->treeGET).placeholder = false;
  (this->treePOST).children.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->treePOST).children.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->treePOST).children.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->treePOST).name._M_dataplus._M_p = (pointer)&(this->treePOST).name.field_2;
  (this->treePOST).name._M_string_length = 0;
  (this->treePOST).name.field_2._M_local_buf[0] = '\0';
  (this->treePOST).placeholder = false;
  (this->treePOST).fn.f_response.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->treePOST).fn.f_response._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->treePOST).fn.f_response.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->treePOST).fn.f_response.super__Function_base._M_functor + 8) = 0;
  (this->treePOST).fn.f_string.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->treePOST).fn.f_string._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->treePOST).fn.f_string.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->treePOST).fn.f_string.super__Function_base._M_functor + 8) = 0;
  (this->treePOST).fn.f_writer.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->treePOST).fn.f_writer._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->treePOST).fn.f_writer.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->treePOST).fn.f_writer.super__Function_base._M_functor + 8) = 0;
  (this->log)._vptr_logger = (_func_int **)&PTR__logger_00127a68;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&(this->log).os);
  (this->log).lv = INFO;
  return;
}

Assistant:

server_t() : treeGET{}, treePOST{} {}